

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O0

void __thiscall
shaping_clipper::apply_window
          (shaping_clipper *this,float *in_frame,float *out_frame,bool add_to_out_frame)

{
  int iVar1;
  int iVar2;
  int local_3c;
  int i;
  int window_stride;
  int total_samples;
  float *window;
  bool add_to_out_frame_local;
  float *out_frame_local;
  float *in_frame_local;
  shaping_clipper *this_local;
  
  _window_stride = std::vector<float,_std::allocator<float>_>::data(&this->window);
  iVar1 = this->size;
  iVar2 = this->max_oversample;
  for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
    if (add_to_out_frame) {
      out_frame[local_3c] = in_frame[local_3c] * *_window_stride + out_frame[local_3c];
    }
    else {
      out_frame[local_3c] = in_frame[local_3c] * *_window_stride;
    }
    _window_stride = _window_stride + iVar2;
  }
  return;
}

Assistant:

void shaping_clipper::apply_window(const float* in_frame, float* out_frame, const bool add_to_out_frame) {
    const float* window = this->window.data();
    int total_samples = this->size;
    int window_stride = this->max_oversample;
    for (int i = 0; i < total_samples; i++) {
        if (add_to_out_frame) {
            out_frame[i] += in_frame[i] * *window;
        } else {
            out_frame[i] = in_frame[i] * *window;
        }
        window += window_stride;
    }
}